

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void uchar_addPropertyStarts_63(USetAdder *sa,UErrorCode *pErrorCode)

{
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  utrie2_enum_63(&propsTrie,(UTrie2EnumValue *)0x0,_enumPropertyStartsRange,sa);
  (*(code *)sa->add)(sa->set,9);
  (*(code *)sa->add)(sa->set,10);
  (*(code *)sa->add)(sa->set,0xe);
  (*(code *)sa->add)(sa->set,0x1c);
  (*(code *)sa->add)(sa->set,0x20);
  (*(code *)sa->add)(sa->set,0x85);
  (*(code *)sa->add)(sa->set,0x86);
  (*(code *)sa->add)(sa->set,0x7f);
  (*(code *)sa->add)(sa->set,0x200a);
  (*(code *)sa->add)(sa->set,0x2010);
  (*(code *)sa->add)(sa->set,0x206a);
  (*(code *)sa->add)(sa->set,0x2070);
  (*(code *)sa->add)(sa->set,0xfeff);
  (*(code *)sa->add)(sa->set,0xff00);
  (*(code *)sa->add)(sa->set,0xa0);
  (*(code *)sa->add)(sa->set,0xa1);
  (*(code *)sa->add)(sa->set,0x2007);
  (*(code *)sa->add)(sa->set,0x2008);
  (*(code *)sa->add)(sa->set,0x202f);
  (*(code *)sa->add)(sa->set,0x2030);
  (*(code *)sa->add)(sa->set,0x61);
  (*(code *)sa->add)(sa->set,0x7b);
  (*(code *)sa->add)(sa->set,0x41);
  (*(code *)sa->add)(sa->set,0x5b);
  (*(code *)sa->add)(sa->set,0xff41);
  (*(code *)sa->add)(sa->set,0xff5b);
  (*(code *)sa->add)(sa->set,0xff21);
  (*(code *)sa->add)(sa->set,0xff3b);
  (*(code *)sa->add)(sa->set,0x67);
  (*(code *)sa->add)(sa->set,0x47);
  (*(code *)sa->add)(sa->set,0xff47);
  (*(code *)sa->add)(sa->set,0xff27);
  (*(code *)sa->add)(sa->set,0x2060);
  (*(code *)sa->add)(sa->set,0xfff0);
  (*(code *)sa->add)(sa->set,0xfffc);
  (*(code *)sa->add)(sa->set,0xe0000);
  (*(code *)sa->add)(sa->set,0xe1000);
  (*(code *)sa->add)(sa->set,0x34f);
  (*(code *)sa->add)(sa->set,0x350);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }